

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O1

void pcp_flow_set_flowp(pcp_flow_t *f,uint8_t dscp_up,uint8_t dscp_down)

{
  pcp_flow_t *fiter;
  bool bVar1;
  
  if (f != (pcp_flow_t *)0x0) {
    bVar1 = dscp_down != '\0' || dscp_up != '\0';
    do {
      if ((bool)f->flowp_option_present != bVar1) {
        f->flowp_option_present = bVar1;
      }
      if (dscp_down != '\0' || dscp_up != '\0') {
        f->flowp_dscp_up = dscp_up;
        f->flowp_dscp_down = dscp_down;
      }
      pcp_flow_updated(f);
      f = f->next_child;
    } while (f != (pcp_flow_s *)0x0);
  }
  return;
}

Assistant:

void pcp_flow_set_flowp(pcp_flow_t *f, uint8_t dscp_up, uint8_t dscp_down) {
    pcp_flow_t *fiter;

    for (fiter = f; fiter; fiter = fiter->next_child) {
        uint8_t fpresent = (dscp_up != 0) || (dscp_down != 0);
        if (fiter->flowp_option_present != fpresent) {
            fiter->flowp_option_present = fpresent;
        }
        if (fpresent) {
            fiter->flowp_dscp_up = dscp_up;
            fiter->flowp_dscp_down = dscp_down;
        }
        pcp_flow_updated(fiter);
    }
}